

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O0

void __thiscall tcmalloc::PageHeap::PrependToFreeList(PageHeap *this,Span *span)

{
  undefined8 this_00;
  pair<std::_Rb_tree_const_iterator<tcmalloc::SpanPtrWithLength>,_bool> pVar1;
  SpanList *list;
  SpanPtrWithLength local_40;
  SpanSetIter local_30;
  pair<std::_Rb_tree_const_iterator<tcmalloc::SpanPtrWithLength>,_bool> p;
  SpanSet *set;
  Span *span_local;
  PageHeap *this_local;
  
  if ((*(uint *)&span->field_0x28 >> 0x18 & 3) == 1) {
    (this->stats_).free_bytes = span->length * 0x2000 + (this->stats_).free_bytes;
  }
  else {
    (this->stats_).unmapped_bytes = span->length * 0x2000 + (this->stats_).unmapped_bytes;
  }
  if (span->length < 0x81) {
    if ((*(uint *)&span->field_0x28 >> 0x18 & 3) == 1) {
      DLL_Prepend(&this->free_[span->length - 1].normal,span);
    }
    else {
      DLL_Prepend(&this->free_[span->length - 1].normal + 1,span);
    }
  }
  else {
    p._8_8_ = &this->large_normal_;
    if ((*(uint *)&span->field_0x28 >> 0x18 & 3) == 2) {
      p._8_8_ = &this->large_returned_;
    }
    this_00 = p._8_8_;
    SpanPtrWithLength::SpanPtrWithLength(&local_40,span);
    pVar1 = std::
            set<tcmalloc::SpanPtrWithLength,_tcmalloc::SpanBestFitLess,_tcmalloc::STLPageHeapAllocator<tcmalloc::SpanPtrWithLength,_void>_>
            ::insert((set<tcmalloc::SpanPtrWithLength,_tcmalloc::SpanBestFitLess,_tcmalloc::STLPageHeapAllocator<tcmalloc::SpanPtrWithLength,_void>_>
                      *)this_00,&local_40);
    local_30._M_node = (_Base_ptr)pVar1.first._M_node;
    p.first._M_node._0_1_ = pVar1.second;
    Span::SetSpanSetIterator(span,&local_30);
  }
  return;
}

Assistant:

void PageHeap::PrependToFreeList(Span* span) {
  ASSERT(lock_.IsHeld());
  ASSERT(span->location != Span::IN_USE);
  if (span->location == Span::ON_NORMAL_FREELIST)
    stats_.free_bytes += (span->length << kPageShift);
  else
    stats_.unmapped_bytes += (span->length << kPageShift);

  if (span->length > kMaxPages) {
    SpanSet *set = &large_normal_;
    if (span->location == Span::ON_RETURNED_FREELIST)
      set = &large_returned_;
    std::pair<SpanSetIter, bool> p =
        set->insert(SpanPtrWithLength(span));
    ASSERT(p.second); // We never have duplicates since span->start is unique.
    span->SetSpanSetIterator(p.first);
    return;
  }

  SpanList* list = &free_[span->length - 1];
  if (span->location == Span::ON_NORMAL_FREELIST) {
    DLL_Prepend(&list->normal, span);
  } else {
    DLL_Prepend(&list->returned, span);
  }
}